

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_doubleFast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  U32 *pUVar5;
  ZSTD_matchState_t *pZVar6;
  BYTE *pBVar7;
  BYTE *pBVar8;
  long lVar9;
  int iVar10;
  U32 UVar11;
  U32 UVar12;
  uint uVar13;
  U32 UVar14;
  U32 UVar15;
  uint uVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  BYTE *pBVar19;
  BYTE *pBVar20;
  size_t sVar21;
  long lVar22;
  U64 UVar23;
  U64 UVar24;
  size_t sVar25;
  BYTE *in_RCX;
  uint *in_RDX;
  void *pvVar26;
  long *in_RSI;
  ulong uVar27;
  ZSTD_matchState_t *in_RDI;
  long in_R8;
  int in_R9D;
  bool bVar28;
  U32 tmpOffset;
  size_t repLength2;
  BYTE *repEnd2;
  BYTE *repMatch2;
  U32 repIndex2;
  U32 current2;
  U32 indexToInsert;
  BYTE *lowMatchPtr_2;
  BYTE *matchEnd_2;
  BYTE *lowMatchPtr_1;
  BYTE *matchEnd_1;
  U32 offset_3;
  BYTE *match3;
  BYTE *match3Base;
  U32 matchIndex3;
  size_t h3;
  U32 offset;
  BYTE *lowMatchPtr;
  BYTE *matchEnd;
  BYTE *repMatchEnd;
  size_t mLength;
  BYTE *repMatch;
  BYTE *repBase;
  U32 repIndex;
  U32 curr;
  BYTE *matchLong;
  BYTE *matchLongBase;
  U32 matchLongIndex;
  size_t hLong;
  BYTE *match;
  BYTE *matchBase;
  U32 matchIndex;
  size_t hSmall;
  U32 offset_2;
  U32 offset_1;
  BYTE *dictEnd;
  BYTE *dictStart;
  BYTE *dictBase;
  BYTE *prefixStart;
  U32 prefixStartIndex;
  U32 dictLimit;
  U32 dictStartIndex;
  U32 lowLimit;
  U32 endIndex;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  U32 hBitsS;
  U32 *hashSmall;
  U32 hBitsL;
  U32 *hashLong;
  ZSTD_compressionParameters *cParams;
  size_t mlBase_3;
  BYTE *litEnd_3;
  BYTE *litLimit_w_3;
  size_t mlBase_2;
  BYTE *litEnd_2;
  BYTE *litLimit_w_2;
  size_t mlBase_1;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  size_t mlBase;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_3;
  ptrdiff_t diff_2;
  BYTE *oend_3;
  BYTE *op_3;
  BYTE *ip_4;
  ptrdiff_t diff_3;
  undefined4 in_stack_fffffffffffff9a8;
  U32 in_stack_fffffffffffff9ac;
  BYTE *in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b8;
  U32 in_stack_fffffffffffff9bc;
  U32 *in_stack_fffffffffffff9c0;
  U32 *in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9d0;
  U32 in_stack_fffffffffffff9d4;
  ZSTD_matchState_t *in_stack_fffffffffffff9d8;
  BYTE *in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e8;
  U32 in_stack_fffffffffffff9ec;
  BYTE *local_610;
  BYTE *local_580;
  BYTE *local_568;
  BYTE *local_550;
  BYTE *local_510;
  BYTE *local_4e8;
  BYTE *local_4e0;
  BYTE *local_4d0;
  uint local_4c0;
  uint local_46c;
  BYTE *local_468;
  ulong local_428;
  BYTE *local_408;
  BYTE *local_3e8;
  uint local_3c8;
  uint local_3c4;
  BYTE *local_370;
  BYTE *local_368;
  size_t local_300;
  size_t local_1b0;
  size_t local_198;
  size_t local_180;
  size_t local_108;
  void *local_f8;
  BYTE *local_f0;
  void *local_b8;
  BYTE *local_b0;
  void *local_78;
  BYTE *local_70;
  
  pUVar5 = in_RDI->hashTable;
  uVar1 = (in_RDI->cParams).hashLog;
  pZVar6 = (ZSTD_matchState_t *)in_RDI->chainTable;
  uVar2 = (in_RDI->cParams).chainLog;
  pBVar17 = in_RCX + in_R8;
  pBVar18 = pBVar17 + -8;
  pBVar7 = (in_RDI->window).base;
  iVar10 = (int)pBVar7;
  UVar11 = ZSTD_getLowestMatchIndex
                     (in_RDI,((int)in_RCX - iVar10) + (int)in_R8,(in_RDI->cParams).windowLog);
  uVar3 = (in_RDI->window).dictLimit;
  local_4c0 = UVar11;
  if (UVar11 < uVar3) {
    local_4c0 = uVar3;
  }
  pBVar19 = pBVar7 + local_4c0;
  pBVar8 = (in_RDI->window).dictBase;
  pBVar20 = pBVar8 + UVar11;
  local_3c4 = *in_RDX;
  local_3c8 = in_RDX[1];
  local_370 = in_RCX;
  local_368 = in_RCX;
  if (local_4c0 == UVar11) {
    local_300 = ZSTD_compressBlock_doubleFast
                          (in_stack_fffffffffffff9d8,
                           (seqStore_t *)
                           CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                           in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,
                           CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
  }
  else {
LAB_00331360:
    uVar3 = local_3c4;
    if (local_368 < pBVar18) {
      if (0x20 < uVar2) {
        __assert_fail("hBits <= 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
      }
      switch(in_R9D) {
      default:
        local_108 = ZSTD_hash4Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
        break;
      case 5:
        local_108 = ZSTD_hash5Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
        break;
      case 6:
        local_108 = ZSTD_hash6Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
        break;
      case 7:
        local_108 = ZSTD_hash7Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
        break;
      case 8:
        local_108 = ZSTD_hash8Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
      }
      uVar16 = pZVar6->hashCache[local_108 - 0x10];
      local_4d0 = pBVar7;
      if (uVar16 < local_4c0) {
        local_4d0 = pBVar8;
      }
      local_3e8 = local_4d0 + uVar16;
      if (0x20 < uVar1) {
        __assert_fail("hBits <= 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
      }
      sVar21 = ZSTD_hash8Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
      uVar4 = pUVar5[sVar21];
      local_4e0 = pBVar7;
      if (uVar4 < local_4c0) {
        local_4e0 = pBVar8;
      }
      local_408 = local_4e0 + uVar4;
      UVar12 = (int)local_368 - iVar10;
      uVar13 = (UVar12 + 1) - local_3c4;
      local_4e8 = pBVar7;
      if (uVar13 < local_4c0) {
        local_4e8 = pBVar8;
      }
      pUVar5[sVar21] = UVar12;
      pZVar6->hashCache[local_108 - 0x10] = UVar12;
      if ((local_4c0 - 1) - uVar13 < 3 || (UVar12 + 1) - UVar11 < local_3c4) {
LAB_00331e66:
        if (UVar11 < uVar4) {
          UVar23 = MEM_read64(local_408);
          UVar24 = MEM_read64(local_368);
          if (UVar23 != UVar24) goto LAB_003326a2;
          local_510 = pBVar19;
          if (uVar4 < local_4c0) {
            local_510 = pBVar20;
          }
          sVar21 = ZSTD_count_2segments
                             ((BYTE *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                              in_stack_fffffffffffff9e0,(BYTE *)in_stack_fffffffffffff9d8,
                              (BYTE *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                              (BYTE *)in_stack_fffffffffffff9c8);
          local_428 = sVar21 + 8;
          local_3c4 = UVar12 - uVar4;
          while( true ) {
            bVar28 = false;
            if (local_370 < local_368 && local_510 < local_408) {
              bVar28 = local_368[-1] == local_408[-1];
            }
            if (!bVar28) break;
            local_368 = local_368 + -1;
            local_408 = local_408 + -1;
            local_428 = local_428 + 1;
          }
          uVar27 = (long)local_368 - (long)local_370;
          if (local_3c4 == 0) {
            __assert_fail("(offset)>0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x6f4f,
                          "size_t ZSTD_compressBlock_doubleFast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          if ((ulong)in_RSI[7] <= (ulong)(in_RSI[1] - *in_RSI >> 3)) {
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x468b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < (ulong)in_RSI[8]) {
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x468d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if ((ulong)(in_RSI[2] + in_RSI[8]) < in_RSI[3] + uVar27) {
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x468e,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar17 < local_370 + uVar27) {
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x468f,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar17 + -0x20 < local_370 + uVar27) {
            ZSTD_safecopyLiterals
                      ((BYTE *)in_stack_fffffffffffff9c0,
                       (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8),
                       in_stack_fffffffffffff9b0,
                       (BYTE *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          }
          else {
            ZSTD_copy16((void *)in_RSI[3],local_370);
            if (0x10 < uVar27) {
              lVar9 = in_RSI[3];
              pvVar26 = (void *)(lVar9 + 0x10);
              lVar22 = (long)pvVar26 - (long)(local_370 + 0x10);
              if ((lVar22 < 0x10) && (-0x10 < lVar22)) {
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x36a6,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              ZSTD_copy16(pvVar26,local_370 + 0x10);
              if (0x10 < (long)(uVar27 - 0x10)) {
                local_b8 = (void *)(lVar9 + 0x20);
                do {
                  local_b0 = local_370 + 0x20;
                  ZSTD_copy16(local_b8,local_b0);
                  ZSTD_copy16((void *)((long)local_b8 + 0x10),local_370 + 0x30);
                  local_b8 = (void *)((long)local_b8 + 0x20);
                  local_370 = local_b0;
                } while (local_b8 < (void *)((long)pvVar26 + (uVar27 - 0x10)));
              }
            }
          }
          in_RSI[3] = uVar27 + in_RSI[3];
          if (0xffff < uVar27) {
            if ((int)in_RSI[9] != 0) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46a0,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            *(undefined4 *)(in_RSI + 9) = 1;
            *(int *)((long)in_RSI + 0x4c) = (int)(in_RSI[1] - *in_RSI >> 3);
          }
          *(short *)(in_RSI[1] + 4) = (short)uVar27;
          *(uint *)in_RSI[1] = local_3c4 + 3;
          if (local_428 < 3) {
            __assert_fail("matchLength >= MINMATCH",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46aa,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0xffff < local_428 - 3) {
            if ((int)in_RSI[9] != 0) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46ad,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            *(undefined4 *)(in_RSI + 9) = 2;
            *(int *)((long)in_RSI + 0x4c) = (int)(in_RSI[1] - *in_RSI >> 3);
          }
          *(short *)(in_RSI[1] + 6) = (short)(local_428 - 3);
          in_RSI[1] = in_RSI[1] + 8;
LAB_003332c1:
          local_3c8 = uVar3;
          goto LAB_003332c3;
        }
LAB_003326a2:
        if (UVar11 < uVar16) {
          UVar14 = MEM_read32(local_3e8);
          UVar15 = MEM_read32(local_368);
          if (UVar14 == UVar15) {
            if (0x20 < uVar1) {
              __assert_fail("hBits <= 32",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
            }
            sVar21 = ZSTD_hash8Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
            local_46c = pUVar5[sVar21];
            local_550 = pBVar7;
            if (local_46c < local_4c0) {
              local_550 = pBVar8;
            }
            local_468 = local_550 + local_46c;
            pUVar5[sVar21] = UVar12 + 1;
            if (UVar11 < local_46c) {
              UVar23 = MEM_read64(local_468);
              UVar24 = MEM_read64(local_368 + 1);
              if (UVar23 != UVar24) goto LAB_00332a9e;
              local_568 = pBVar19;
              if (local_46c < local_4c0) {
                local_568 = pBVar20;
              }
              sVar21 = ZSTD_count_2segments
                                 ((BYTE *)CONCAT44(in_stack_fffffffffffff9ec,
                                                   in_stack_fffffffffffff9e8),
                                  in_stack_fffffffffffff9e0,(BYTE *)in_stack_fffffffffffff9d8,
                                  (BYTE *)CONCAT44(in_stack_fffffffffffff9d4,
                                                   in_stack_fffffffffffff9d0),
                                  (BYTE *)in_stack_fffffffffffff9c8);
              local_428 = sVar21 + 8;
              local_368 = local_368 + 1;
              local_46c = (UVar12 + 1) - local_46c;
              while( true ) {
                bVar28 = false;
                if (local_370 < local_368 && local_568 < local_468) {
                  bVar28 = local_368[-1] == local_468[-1];
                }
                if (!bVar28) break;
                local_368 = local_368 + -1;
                local_468 = local_468 + -1;
                local_428 = local_428 + 1;
              }
            }
            else {
LAB_00332a9e:
              local_580 = pBVar19;
              if (uVar16 < local_4c0) {
                local_580 = pBVar20;
              }
              sVar21 = ZSTD_count_2segments
                                 ((BYTE *)CONCAT44(in_stack_fffffffffffff9ec,
                                                   in_stack_fffffffffffff9e8),
                                  in_stack_fffffffffffff9e0,(BYTE *)in_stack_fffffffffffff9d8,
                                  (BYTE *)CONCAT44(in_stack_fffffffffffff9d4,
                                                   in_stack_fffffffffffff9d0),
                                  (BYTE *)in_stack_fffffffffffff9c8);
              local_428 = sVar21 + 4;
              local_46c = UVar12 - uVar16;
              while( true ) {
                bVar28 = false;
                if (local_370 < local_368 && local_580 < local_3e8) {
                  bVar28 = local_368[-1] == local_3e8[-1];
                }
                if (!bVar28) break;
                local_368 = local_368 + -1;
                local_3e8 = local_3e8 + -1;
                local_428 = local_428 + 1;
              }
            }
            local_3c4 = local_46c;
            uVar27 = (long)local_368 - (long)local_370;
            if (local_46c == 0) {
              __assert_fail("(offset)>0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x6f68,
                            "size_t ZSTD_compressBlock_doubleFast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                           );
            }
            if ((ulong)in_RSI[7] <= (ulong)(in_RSI[1] - *in_RSI >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x468b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < (ulong)in_RSI[8]) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x468d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if ((ulong)(in_RSI[2] + in_RSI[8]) < in_RSI[3] + uVar27) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x468e,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar17 < local_370 + uVar27) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x468f,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar17 + -0x20 < local_370 + uVar27) {
              ZSTD_safecopyLiterals
                        ((BYTE *)in_stack_fffffffffffff9c0,
                         (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8),
                         in_stack_fffffffffffff9b0,
                         (BYTE *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            }
            else {
              ZSTD_copy16((void *)in_RSI[3],local_370);
              if (0x10 < uVar27) {
                lVar9 = in_RSI[3];
                pvVar26 = (void *)(lVar9 + 0x10);
                lVar22 = (long)pvVar26 - (long)(local_370 + 0x10);
                if ((lVar22 < 0x10) && (-0x10 < lVar22)) {
                  __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x36a6,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                ZSTD_copy16(pvVar26,local_370 + 0x10);
                if (0x10 < (long)(uVar27 - 0x10)) {
                  local_78 = (void *)(lVar9 + 0x20);
                  do {
                    local_70 = local_370 + 0x20;
                    ZSTD_copy16(local_78,local_70);
                    ZSTD_copy16((void *)((long)local_78 + 0x10),local_370 + 0x30);
                    local_78 = (void *)((long)local_78 + 0x20);
                    local_370 = local_70;
                  } while (local_78 < (void *)((long)pvVar26 + (uVar27 - 0x10)));
                }
              }
            }
            in_RSI[3] = uVar27 + in_RSI[3];
            if (0xffff < uVar27) {
              if ((int)in_RSI[9] != 0) {
                __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x46a0,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              *(undefined4 *)(in_RSI + 9) = 1;
              *(int *)((long)in_RSI + 0x4c) = (int)(in_RSI[1] - *in_RSI >> 3);
            }
            *(short *)(in_RSI[1] + 4) = (short)uVar27;
            *(uint *)in_RSI[1] = local_46c + 3;
            if (local_428 < 3) {
              __assert_fail("matchLength >= MINMATCH",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46aa,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0xffff < local_428 - 3) {
              if ((int)in_RSI[9] != 0) {
                __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x46ad,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              *(undefined4 *)(in_RSI + 9) = 2;
              *(int *)((long)in_RSI + 0x4c) = (int)(in_RSI[1] - *in_RSI >> 3);
            }
            *(short *)(in_RSI[1] + 6) = (short)(local_428 - 3);
            in_RSI[1] = in_RSI[1] + 8;
            goto LAB_003332c1;
          }
        }
        local_368 = local_368 + ((long)local_368 - (long)local_370 >> 8) + 1;
      }
      else {
        UVar14 = MEM_read32(local_4e8 + uVar13);
        UVar15 = MEM_read32(local_368 + 1);
        if (UVar14 != UVar15) goto LAB_00331e66;
        sVar21 = ZSTD_count_2segments
                           ((BYTE *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                            in_stack_fffffffffffff9e0,(BYTE *)in_stack_fffffffffffff9d8,
                            (BYTE *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                            (BYTE *)in_stack_fffffffffffff9c8);
        local_428 = sVar21 + 4;
        local_368 = local_368 + 1;
        uVar27 = (long)local_368 - (long)local_370;
        if ((ulong)in_RSI[7] <= (ulong)(in_RSI[1] - *in_RSI >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < (ulong)in_RSI[8]) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if ((ulong)(in_RSI[2] + in_RSI[8]) < in_RSI[3] + uVar27) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar17 < local_370 + uVar27) {
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar17 + -0x20 < local_370 + uVar27) {
          ZSTD_safecopyLiterals
                    ((BYTE *)in_stack_fffffffffffff9c0,
                     (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8),
                     in_stack_fffffffffffff9b0,
                     (BYTE *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        }
        else {
          ZSTD_copy16((void *)in_RSI[3],local_370);
          if (0x10 < uVar27) {
            lVar9 = in_RSI[3];
            pvVar26 = (void *)(lVar9 + 0x10);
            lVar22 = (long)pvVar26 - (long)(local_370 + 0x10);
            if ((lVar22 < 0x10) && (-0x10 < lVar22)) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            ZSTD_copy16(pvVar26,local_370 + 0x10);
            if (0x10 < (long)(uVar27 - 0x10)) {
              local_f8 = (void *)(lVar9 + 0x20);
              do {
                local_f0 = local_370 + 0x20;
                ZSTD_copy16(local_f8,local_f0);
                ZSTD_copy16((void *)((long)local_f8 + 0x10),local_370 + 0x30);
                local_f8 = (void *)((long)local_f8 + 0x20);
                local_370 = local_f0;
              } while (local_f8 < (void *)((long)pvVar26 + (uVar27 - 0x10)));
            }
          }
        }
        in_RSI[3] = uVar27 + in_RSI[3];
        if (0xffff < uVar27) {
          if ((int)in_RSI[9] != 0) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          *(undefined4 *)(in_RSI + 9) = 1;
          *(int *)((long)in_RSI + 0x4c) = (int)(in_RSI[1] - *in_RSI >> 3);
        }
        *(short *)(in_RSI[1] + 4) = (short)uVar27;
        *(undefined4 *)in_RSI[1] = 1;
        if (local_428 < 3) {
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < sVar21 + 1) {
          if ((int)in_RSI[9] != 0) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          *(undefined4 *)(in_RSI + 9) = 2;
          *(int *)((long)in_RSI + 0x4c) = (int)(in_RSI[1] - *in_RSI >> 3);
        }
        *(short *)(in_RSI[1] + 6) = (short)(sVar21 + 1);
        in_RSI[1] = in_RSI[1] + 8;
LAB_003332c3:
        local_370 = local_368 + local_428;
        local_368 = local_370;
        if (local_370 <= pBVar18) {
          if (0x20 < uVar1) {
            __assert_fail("hBits <= 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
          }
          sVar21 = ZSTD_hash8Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
          pUVar5[sVar21] = UVar12 + 2;
          if (0x20 < uVar1) {
            __assert_fail("hBits <= 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
          }
          sVar21 = ZSTD_hash8Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
          pUVar5[sVar21] = ((int)local_370 + -2) - iVar10;
          if (0x20 < uVar2) {
            __assert_fail("hBits <= 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
          }
          switch(in_R9D) {
          default:
            local_180 = ZSTD_hash4Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
            break;
          case 5:
            local_180 = ZSTD_hash5Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
            break;
          case 6:
            local_180 = ZSTD_hash6Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
            break;
          case 7:
            local_180 = ZSTD_hash7Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
            break;
          case 8:
            local_180 = ZSTD_hash8Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
          }
          pZVar6->hashCache[local_180 - 0x10] = UVar12 + 2;
          if (0x20 < uVar2) {
            __assert_fail("hBits <= 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
          }
          switch(in_R9D) {
          default:
            local_198 = ZSTD_hash4Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
            break;
          case 5:
            local_198 = ZSTD_hash5Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
            break;
          case 6:
            local_198 = ZSTD_hash6Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
            break;
          case 7:
            local_198 = ZSTD_hash7Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
            break;
          case 8:
            local_198 = ZSTD_hash8Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
          }
          pZVar6->hashCache[local_198 - 0x10] = ((int)local_370 + -1) - iVar10;
          for (; uVar3 = local_3c8, local_370 = local_368, local_368 <= pBVar18;
              local_368 = local_368 + sVar21 + 4) {
            UVar12 = (int)local_368 - iVar10;
            uVar16 = UVar12 - local_3c8;
            if (uVar16 < local_4c0) {
              local_610 = pBVar8 + uVar16;
            }
            else {
              local_610 = pBVar7 + uVar16;
            }
            if ((local_4c0 - 1) - uVar16 < 3 || UVar12 - UVar11 < local_3c8) break;
            in_stack_fffffffffffff9ec = MEM_read32(local_610);
            UVar14 = MEM_read32(local_368);
            if (in_stack_fffffffffffff9ec != UVar14) break;
            in_stack_fffffffffffff9e0 = pBVar17;
            if (uVar16 < local_4c0) {
              in_stack_fffffffffffff9e0 = pBVar8 + local_4c0;
            }
            sVar21 = ZSTD_count_2segments
                               ((BYTE *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8
                                                ),in_stack_fffffffffffff9e0,
                                (BYTE *)in_stack_fffffffffffff9d8,
                                (BYTE *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0
                                                ),(BYTE *)in_stack_fffffffffffff9c8);
            local_3c8 = local_3c4;
            local_3c4 = uVar3;
            if ((ulong)in_RSI[7] <= (ulong)(in_RSI[1] - *in_RSI >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x468b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < (ulong)in_RSI[8]) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x468d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if ((ulong)(in_RSI[2] + in_RSI[8]) < (ulong)in_RSI[3]) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x468e,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar17 < local_368) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x468f,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar17 + -0x20 < local_368) {
              ZSTD_safecopyLiterals
                        ((BYTE *)in_stack_fffffffffffff9c0,
                         (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8),
                         in_stack_fffffffffffff9b0,
                         (BYTE *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            }
            else {
              ZSTD_copy16((void *)in_RSI[3],local_368);
            }
            in_RSI[3] = in_RSI[3];
            *(undefined2 *)(in_RSI[1] + 4) = 0;
            *(undefined4 *)in_RSI[1] = 1;
            if (sVar21 + 4 < 3) {
              __assert_fail("matchLength >= MINMATCH",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46aa,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0xffff < sVar21 + 1) {
              if ((int)in_RSI[9] != 0) {
                __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x46ad,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              *(undefined4 *)(in_RSI + 9) = 2;
              *(int *)((long)in_RSI + 0x4c) = (int)(in_RSI[1] - *in_RSI >> 3);
            }
            *(short *)(in_RSI[1] + 6) = (short)(sVar21 + 1);
            in_RSI[1] = in_RSI[1] + 8;
            if (0x20 < uVar2) {
              __assert_fail("hBits <= 32",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
            }
            in_stack_fffffffffffff9c8 = (U32 *)(ulong)(in_R9D - 4);
            in_stack_fffffffffffff9d4 = UVar12;
            in_stack_fffffffffffff9d8 = pZVar6;
            switch(in_stack_fffffffffffff9c8) {
            default:
              local_1b0 = ZSTD_hash4Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
              break;
            case (U32 *)0x1:
              local_1b0 = ZSTD_hash5Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
              break;
            case (U32 *)0x2:
              local_1b0 = ZSTD_hash6Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
              break;
            case (U32 *)0x3:
              local_1b0 = ZSTD_hash7Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
              break;
            case (U32 *)0x4:
              local_1b0 = ZSTD_hash8Ptr(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
            }
            in_stack_fffffffffffff9d8->hashCache[local_1b0 - 0x10] = in_stack_fffffffffffff9d4;
            if (0x20 < uVar1) {
              __assert_fail("hBits <= 32",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
            }
            in_stack_fffffffffffff9b0 = (BYTE *)0x4;
            in_stack_fffffffffffff9c0 = pUVar5;
            sVar25 = ZSTD_hash8Ptr((void *)0x4,in_stack_fffffffffffff9ac);
            in_stack_fffffffffffff9c0[sVar25] = UVar12;
            in_stack_fffffffffffff9bc = UVar12;
          }
        }
      }
      goto LAB_00331360;
    }
    *in_RDX = local_3c4;
    in_RDX[1] = local_3c8;
    local_300 = (long)pBVar17 - (long)local_370;
  }
  return local_300;
}

Assistant:

static size_t ZSTD_compressBlock_doubleFast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize,
        U32 const mls /* template */)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32* const hashLong = ms->hashTable;
    U32  const hBitsL = cParams->hashLog;
    U32* const hashSmall = ms->chainTable;
    U32  const hBitsS = cParams->chainLog;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    const BYTE* const base = ms->window.base;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = (dictLimit > lowLimit) ? dictLimit : lowLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_doubleFast_extDict_generic (srcSize=%zu)", srcSize);

    /* if extDict is invalidated due to maxDistance, switch to "regular" variant */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_doubleFast(ms, seqStore, rep, src, srcSize);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t hSmall = ZSTD_hashPtr(ip, hBitsS, mls);
        const U32 matchIndex = hashSmall[hSmall];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE* match = matchBase + matchIndex;

        const size_t hLong = ZSTD_hashPtr(ip, hBitsL, 8);
        const U32 matchLongIndex = hashLong[hLong];
        const BYTE* const matchLongBase = matchLongIndex < prefixStartIndex ? dictBase : base;
        const BYTE* matchLong = matchLongBase + matchLongIndex;

        const U32 curr = (U32)(ip-base);
        const U32 repIndex = curr + 1 - offset_1;   /* offset_1 expected <= curr +1 */
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        size_t mLength;
        hashSmall[hSmall] = hashLong[hLong] = curr;   /* update hash table */

        if ((((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow : ensure repIndex doesn't overlap dict + prefix */
            & (offset_1 <= curr+1 - dictStartIndex)) /* note: we are searching at curr+1 */
          && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            mLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, REPCODE1_TO_OFFBASE, mLength);
        } else {
            if ((matchLongIndex > dictStartIndex) && (MEM_read64(matchLong) == MEM_read64(ip))) {
                const BYTE* const matchEnd = matchLongIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchLongIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 offset;
                mLength = ZSTD_count_2segments(ip+8, matchLong+8, iend, matchEnd, prefixStart) + 8;
                offset = curr - matchLongIndex;
                while (((ip>anchor) & (matchLong>lowMatchPtr)) && (ip[-1] == matchLong[-1])) { ip--; matchLong--; mLength++; }   /* catch up */
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, OFFSET_TO_OFFBASE(offset), mLength);

            } else if ((matchIndex > dictStartIndex) && (MEM_read32(match) == MEM_read32(ip))) {
                size_t const h3 = ZSTD_hashPtr(ip+1, hBitsL, 8);
                U32 const matchIndex3 = hashLong[h3];
                const BYTE* const match3Base = matchIndex3 < prefixStartIndex ? dictBase : base;
                const BYTE* match3 = match3Base + matchIndex3;
                U32 offset;
                hashLong[h3] = curr + 1;
                if ( (matchIndex3 > dictStartIndex) && (MEM_read64(match3) == MEM_read64(ip+1)) ) {
                    const BYTE* const matchEnd = matchIndex3 < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex3 < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+9, match3+8, iend, matchEnd, prefixStart) + 8;
                    ip++;
                    offset = curr+1 - matchIndex3;
                    while (((ip>anchor) & (match3>lowMatchPtr)) && (ip[-1] == match3[-1])) { ip--; match3--; mLength++; } /* catch up */
                } else {
                    const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                    offset = curr - matchIndex;
                    while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                }
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, OFFSET_TO_OFFBASE(offset), mLength);

            } else {
                ip += ((ip-anchor) >> kSearchStrength) + 1;
                continue;
        }   }

        /* move to next sequence start */
        ip += mLength;
        anchor = ip;

        if (ip <= ilimit) {
            /* Complementary insertion */
            /* done after iLimit test, as candidates could be > iend-8 */
            {   U32 const indexToInsert = curr+2;
                hashLong[ZSTD_hashPtr(base+indexToInsert, hBitsL, 8)] = indexToInsert;
                hashLong[ZSTD_hashPtr(ip-2, hBitsL, 8)] = (U32)(ip-2-base);
                hashSmall[ZSTD_hashPtr(base+indexToInsert, hBitsS, mls)] = indexToInsert;
                hashSmall[ZSTD_hashPtr(ip-1, hBitsS, mls)] = (U32)(ip-1-base);
            }

            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3)   /* intentional overflow : ensure repIndex2 doesn't overlap dict + prefix */
                    & (offset_2 <= current2 - dictStartIndex))
                  && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, iend, REPCODE1_TO_OFFBASE, repLength2);
                    hashSmall[ZSTD_hashPtr(ip, hBitsS, mls)] = current2;
                    hashLong[ZSTD_hashPtr(ip, hBitsL, 8)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}